

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skynet_mq.c
# Opt level: O2

void skynet_globalmq_push(message_queue *queue)

{
  global_queue *pgVar1;
  global_queue *pgVar2;
  
  pgVar1 = Q;
  spinlock_lock(&Q->lock);
  if (queue->next == (message_queue *)0x0) {
    pgVar2 = (global_queue *)&pgVar1->tail->next;
    if (pgVar1->tail == (message_queue *)0x0) {
      pgVar2 = pgVar1;
    }
    pgVar2->head = queue;
    pgVar1->tail = queue;
    (pgVar1->lock).lock = 0;
    return;
  }
  __assert_fail("queue->next == NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/microcai[P]skynet/skynet-src/skynet_mq.c"
                ,0x30,"void skynet_globalmq_push(struct message_queue *)");
}

Assistant:

void 
skynet_globalmq_push(struct message_queue * queue) {
	struct global_queue *q= Q;

	SPIN_LOCK(q)
	assert(queue->next == NULL);
	if(q->tail) {
		q->tail->next = queue;
		q->tail = queue;
	} else {
		q->head = q->tail = queue;
	}
	SPIN_UNLOCK(q)
}